

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexMathFpu.cpp
# Opt level: O1

void catchSigFpe(int sig,siginfo_t *info,ucontext_t *ucon)

{
  char *pcVar1;
  undefined8 uVar2;
  
  MXCSR = ((ucon->uc_mcontext).fpregs)->mxcsr & 0xffffffc0;
  if (Iex_3_2::(anonymous_namespace)::fpeHandler == (code *)0x0) {
    return;
  }
  if (info->si_code == 0) {
    pcVar1 = "Floating-point exception, caused by a signal sent from another process.";
    goto LAB_0015ec72;
  }
  if (sig != 8) goto switchD_0015ebef_default;
  switch(info->si_code) {
  case 1:
    pcVar1 = "Integer division by zero.";
    goto LAB_0015ec59;
  case 2:
    pcVar1 = "Integer overflow.";
    goto LAB_0015ec59;
  case 3:
    pcVar1 = "Floating-point division by zero.";
    uVar2 = 4;
    break;
  case 4:
    pcVar1 = "Floating-point overflow.";
    uVar2 = 1;
    break;
  case 5:
    pcVar1 = "Floating-point underflow.";
    uVar2 = 2;
    break;
  case 6:
    pcVar1 = "Inexact floating-point result.";
    uVar2 = 8;
    break;
  case 7:
    pcVar1 = "Invalid floating-point operation.";
    uVar2 = 0x10;
    break;
  case 8:
    pcVar1 = "Subscript out of range.";
LAB_0015ec59:
    (*Iex_3_2::(anonymous_namespace)::fpeHandler)(0,pcVar1);
switchD_0015ebef_default:
    pcVar1 = "Floating-point exception.";
LAB_0015ec72:
    uVar2 = 0;
    break;
  default:
    goto switchD_0015ebef_default;
  }
  (*Iex_3_2::(anonymous_namespace)::fpeHandler)(uVar2,pcVar1);
  return;
}

Assistant:

void
catchSigFpe (int sig, siginfo_t* info, ucontext_t* ucon)
{
    debug ("catchSigFpe (sig = " << sig << ", ...)\n");

    FpuControl::restoreControlRegs (*ucon, true);

    if (fpeHandler == 0) return;

    if (info->si_code == SI_USER)
    {
        fpeHandler (
            0,
            "Floating-point exception, caused by "
            "a signal sent from another process.");
        return;
    }

    if (sig == SIGFPE)
    {
        switch (info->si_code)
        {
                //
                // IEEE 754 floating point exceptions:
                //

            case FPE_FLTDIV:
                fpeHandler (IEEE_DIVZERO, "Floating-point division by zero.");
                return;

            case FPE_FLTOVF:
                fpeHandler (IEEE_OVERFLOW, "Floating-point overflow.");
                return;

            case FPE_FLTUND:
                fpeHandler (IEEE_UNDERFLOW, "Floating-point underflow.");
                return;

            case FPE_FLTRES:
                fpeHandler (IEEE_INEXACT, "Inexact floating-point result.");
                return;

            case FPE_FLTINV:
                fpeHandler (IEEE_INVALID, "Invalid floating-point operation.");
                return;

                //
                // Other arithmetic exceptions which can also
                // be trapped by the operating system:
                //

            case FPE_INTDIV: fpeHandler (0, "Integer division by zero."); break;

            case FPE_INTOVF: fpeHandler (0, "Integer overflow."); break;

            case FPE_FLTSUB: fpeHandler (0, "Subscript out of range."); break;
        }
    }

    fpeHandler (0, "Floating-point exception.");
}